

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O3

void mpc_sbox_prove_s128_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,mzd_local_t *mask_a,
               mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM4 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  word128 x2m [3] [2];
  word128 r2m [3] [2];
  word128 r1m [3] [2];
  word128 r0m [3] [2];
  word128 r1s [3] [2];
  word128 r0s [3] [2];
  ulong auStack_308 [2];
  ulong auStack_2f8 [10];
  ulong auStack_2a8 [2];
  ulong auStack_298 [10];
  undefined1 auStack_248 [16];
  undefined1 auStack_238 [80];
  ulong auStack_1e8 [2];
  ulong auStack_1d8 [10];
  ulong auStack_188 [2];
  ulong auStack_178 [10];
  undefined1 auStack_128 [16];
  undefined1 auStack_118 [80];
  undefined1 auStack_c8 [16];
  undefined1 auStack_b8 [56];
  word128 x1s [3] [2];
  
  lVar3 = 0;
  do {
    auVar10 = *(undefined1 (*) [16])((long)in->w64 + lVar3);
    auVar12 = *(undefined1 (*) [16])((long)in->w64 + lVar3 + 0x10);
    auVar11 = vandpd_avx(auVar10,in_ZMM0._0_16_);
    auVar7 = vandpd_avx(auVar10,in_ZMM2._0_16_);
    auVar10 = vandpd_avx(auVar10,in_ZMM4._0_16_);
    auVar8 = vandpd_avx(auVar12,in_ZMM1._0_16_);
    auVar9 = vandpd_avx(auVar12,in_ZMM3._0_16_);
    *(undefined1 (*) [16])(auStack_248 + lVar3) = auVar10;
    auVar10 = vandpd_avx(auVar12,in_ZMM5._0_16_);
    auVar12 = vpslldq_avx(auVar11,8);
    auVar12 = vpshldq_avx512_vbmi2(auVar11,auVar12,2);
    *(undefined1 (*) [16])(auStack_238 + lVar3) = auVar10;
    auVar10 = vpsrldq_avx(auVar11,8);
    auVar11 = vpsrlq_avx(auVar10,0x3e);
    *(undefined1 (*) [16])((long)auStack_2a8 + lVar3) = auVar12;
    auVar10 = vpslldq_avx(auVar8,8);
    auVar10 = vpshldq_avx512_vbmi2(auVar8,auVar10,2);
    auVar10 = vpor_avx(auVar10,auVar11);
    auVar12 = vpslldq_avx(auVar7,8);
    auVar12 = vpshldq_avx512_vbmi2(auVar7,auVar12,1);
    *(undefined1 (*) [16])((long)auStack_298 + lVar3) = auVar10;
    auVar10 = vpsrldq_avx(auVar7,8);
    auVar11 = vpsrlq_avx(auVar10,0x3f);
    *(undefined1 (*) [16])((long)auStack_308 + lVar3) = auVar12;
    auVar10 = vpslldq_avx(auVar9,8);
    auVar10 = vpshldq_avx512_vbmi2(auVar9,auVar10,1);
    auVar10 = vpor_avx(auVar10,auVar11);
    *(undefined1 (*) [16])((long)auStack_2f8 + lVar3) = auVar10;
    auVar10 = *(undefined1 (*) [16])((long)rvec + lVar3);
    auVar12 = *(undefined1 (*) [16])((long)rvec + lVar3 + 0x10);
    auVar11 = vandpd_avx(auVar10,in_ZMM0._0_16_);
    auVar7 = vandpd_avx(auVar10,in_ZMM2._0_16_);
    auVar10 = vandpd_avx(auVar10,in_ZMM4._0_16_);
    auVar8 = vandpd_avx(auVar12,in_ZMM1._0_16_);
    auVar9 = vandpd_avx(auVar12,in_ZMM3._0_16_);
    *(undefined1 (*) [16])((long)auStack_1e8 + lVar3) = auVar10;
    auVar10 = vandpd_avx(auVar12,in_ZMM5._0_16_);
    auVar12 = vpslldq_avx(auVar11,8);
    *(undefined1 (*) [16])(auStack_128 + lVar3) = auVar11;
    *(undefined1 (*) [16])((long)auStack_188 + lVar3) = auVar7;
    *(undefined1 (*) [16])(auStack_118 + lVar3) = auVar8;
    *(undefined1 (*) [16])((long)auStack_178 + lVar3) = auVar9;
    auVar12 = vpshldq_avx512_vbmi2(auVar11,auVar12,2);
    *(undefined1 (*) [16])((long)auStack_1d8 + lVar3) = auVar10;
    auVar10 = vpsrldq_avx(auVar11,8);
    auVar11 = vpsrlq_avx(auVar10,0x3e);
    *(undefined1 (*) [16])((long)x1s[0][1] + lVar3 + 8) = auVar12;
    auVar10 = vpslldq_avx(auVar8,8);
    auVar10 = vpshldq_avx512_vbmi2(auVar8,auVar10,2);
    auVar10 = vpor_avx(auVar10,auVar11);
    auVar12 = vpslldq_avx(auVar7,8);
    auVar12 = vpshldq_avx512_vbmi2(auVar7,auVar12,1);
    *(undefined1 (*) [16])((long)x1s[1][0] + lVar3 + 8) = auVar10;
    auVar10 = vpsrldq_avx(auVar7,8);
    auVar11 = vpsrlq_avx(auVar10,0x3f);
    *(undefined1 (*) [16])(auStack_c8 + lVar3) = auVar12;
    auVar10 = vpslldq_avx(auVar9,8);
    auVar10 = vpshldq_avx512_vbmi2(auVar9,auVar10,1);
    auVar10 = vpor_avx(auVar10,auVar11);
    *(undefined1 (*) [16])(auStack_b8 + lVar3) = auVar10;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x60);
  lVar3 = 1;
  lVar4 = 0;
  do {
    lVar6 = 0;
    if (lVar4 != 0x40) {
      lVar6 = lVar3;
    }
    lVar3 = lVar3 + 1;
    auVar11 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_2a8 + lVar6 * 4),
                                  *(undefined1 (*) [16])((long)auStack_2a8 + lVar4),
                                  *(undefined1 (*) [16])((long)auStack_308 + lVar4),0x28);
    auVar10 = vpand_avx(*(undefined1 (*) [16])((long)auStack_2a8 + lVar4),
                        *(undefined1 (*) [16])(auStack_308 + lVar6 * 4));
    auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_298 + lVar6 * 4),
                                 *(undefined1 (*) [16])((long)auStack_298 + lVar4),
                                 *(undefined1 (*) [16])((long)auStack_2f8 + lVar4),0x28);
    auVar12 = vpand_avx(*(undefined1 (*) [16])((long)auStack_298 + lVar4),
                        *(undefined1 (*) [16])(auStack_2f8 + lVar6 * 4));
    auVar11 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)auStack_1e8 + lVar4) ^
                                  *(undefined1 (*) [16])(auStack_1e8 + lVar6 * 4),auVar10,auVar11,
                                  0x96);
    auVar10 = *(undefined1 (*) [16])(auStack_1d8 + lVar6 * 4);
    *(undefined1 (*) [16])(auStack_128 + lVar4) = auVar11;
    auVar10 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)auStack_1d8 + lVar4) ^ auVar10,
                                  auVar12,auVar7,0x96);
    *(undefined1 (*) [16])(auStack_118 + lVar4) = auVar10;
    *(undefined1 (*) [16])((long)view + lVar4) = auVar11;
    *(undefined1 (*) [16])((long)view + lVar4 + 0x10) = auVar10;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x60);
  lVar3 = 1;
  lVar4 = 0;
  do {
    lVar6 = 0;
    if (lVar4 != 0x40) {
      lVar6 = lVar3;
    }
    lVar3 = lVar3 + 1;
    lVar5 = lVar6 * 0x20;
    auVar11 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_308 + lVar6 * 4),
                                  *(undefined1 (*) [16])((long)auStack_308 + lVar4),
                                  *(undefined1 (*) [16])(auStack_248 + lVar4),0x28);
    auVar10 = vpand_avx(*(undefined1 (*) [16])((long)auStack_308 + lVar4),
                        *(undefined1 (*) [16])(auStack_248 + lVar5));
    auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_2f8 + lVar6 * 4),
                                 *(undefined1 (*) [16])((long)auStack_2f8 + lVar4),
                                 *(undefined1 (*) [16])(auStack_238 + lVar4),0x28);
    auVar12 = vpand_avx(*(undefined1 (*) [16])((long)auStack_2f8 + lVar4),
                        *(undefined1 (*) [16])(auStack_238 + lVar5));
    auVar11 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_c8 + lVar4) ^
                                  *(undefined1 (*) [16])(auStack_c8 + lVar5),auVar10,auVar11,0x96);
    auVar10 = *(undefined1 (*) [16])(x1s[lVar6 + -2][0] + 1);
    auVar8 = vpsrldq_avx(auVar11,8);
    *(undefined1 (*) [16])((long)auStack_1e8 + lVar4) = auVar11;
    auVar11 = vpshldq_avx512_vbmi2(auVar8,auVar11,0x3f);
    auVar10 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_b8 + lVar4) ^ auVar10,auVar12,
                                  auVar7,0x96);
    auVar12 = vpslldq_avx(auVar10,8);
    *(undefined1 (*) [16])((long)auStack_1d8 + lVar4) = auVar10;
    auVar7 = vpsrldq_avx(auVar10,8);
    auVar12 = vpsllq_avx(auVar12,0x3f);
    auVar10 = vpshldq_avx512_vbmi2(auVar7,auVar10,0x3f);
    auVar12 = vpternlogq_avx512vl(auVar11,auVar12,*(undefined1 (*) [16])((long)view + lVar4),0x56);
    *(undefined1 (*) [16])((long)view + lVar4) = auVar12;
    *(undefined1 (*) [16])((long)view + lVar4 + 0x10) =
         auVar10 ^ *(undefined1 (*) [16])((long)view + lVar4 + 0x10);
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x60);
  lVar3 = 1;
  lVar4 = 0;
  do {
    auVar10 = *(undefined1 (*) [16])((long)x1s[1][0] + lVar4 + 8);
    lVar6 = 0;
    if (lVar4 != 0x40) {
      lVar6 = lVar3;
    }
    lVar3 = lVar3 + 1;
    auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_2a8 + lVar6 * 4),
                                 *(undefined1 (*) [16])((long)auStack_2a8 + lVar4),
                                 *(undefined1 (*) [16])(auStack_248 + lVar4),0x28);
    auVar12 = vpand_avx(*(undefined1 (*) [16])((long)auStack_2a8 + lVar4),
                        *(undefined1 (*) [16])(auStack_248 + lVar6 * 0x20));
    auVar8 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_298 + lVar6 * 4),
                                 *(undefined1 (*) [16])((long)auStack_298 + lVar4),
                                 *(undefined1 (*) [16])(auStack_238 + lVar4),0x28);
    auVar11 = vpand_avx(*(undefined1 (*) [16])((long)auStack_298 + lVar4),
                        *(undefined1 (*) [16])(auStack_238 + lVar6 * 0x20));
    auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)x1s[0][1] + lVar4 + 8) ^
                                 *(undefined1 (*) [16])(x1s[lVar6][1] + 1),auVar12,auVar7,0x96);
    auVar12 = *(undefined1 (*) [16])(x1s[lVar6 + 1][0] + 1);
    auVar9 = vpsrldq_avx(auVar7,8);
    *(undefined1 (*) [16])((long)auStack_188 + lVar4) = auVar7;
    auVar7 = vpshldq_avx512_vbmi2(auVar9,auVar7,0x3e);
    auVar10 = vpternlogq_avx512vl(auVar10 ^ auVar12,auVar11,auVar8,0x96);
    auVar12 = vpslldq_avx(auVar10,8);
    *(undefined1 (*) [16])((long)auStack_178 + lVar4) = auVar10;
    auVar11 = vpsrldq_avx(auVar10,8);
    auVar12 = vpsllq_avx(auVar12,0x3e);
    auVar10 = vpshldq_avx512_vbmi2(auVar11,auVar10,0x3e);
    auVar12 = vpternlogq_avx512vl(auVar7,auVar12,*(undefined1 (*) [16])((long)view + lVar4),0x56);
    *(undefined1 (*) [16])((long)view + lVar4) = auVar12;
    *(undefined1 (*) [16])((long)view + lVar4 + 0x10) =
         auVar10 ^ *(undefined1 (*) [16])((long)view + lVar4 + 0x10);
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x60);
  lVar3 = 0;
  do {
    uVar1 = *(ulong *)((long)auStack_2a8 + lVar3 + 8);
    uVar2 = *(ulong *)((long)auStack_298 + lVar3 + 8);
    auVar10._0_8_ = *(ulong *)((long)auStack_2a8 + lVar3) ^ *(ulong *)((long)auStack_1e8 + lVar3);
    auVar10._8_8_ = uVar1 ^ *(ulong *)((long)auStack_1e8 + lVar3 + 8);
    auVar8._0_8_ = *(ulong *)((long)auStack_2a8 + lVar3) ^ *(ulong *)((long)auStack_308 + lVar3);
    auVar8._8_8_ = uVar1 ^ *(ulong *)((long)auStack_308 + lVar3 + 8);
    auVar7._0_8_ = auVar8._0_8_ ^ *(ulong *)((long)auStack_188 + lVar3);
    auVar7._8_8_ = auVar8._8_8_ ^ *(ulong *)((long)auStack_188 + lVar3 + 8);
    *(undefined1 (*) [16])((long)auStack_1e8 + lVar3) = auVar10;
    auVar12 = vpsrldq_avx(auVar10,8);
    auVar11._0_8_ = *(ulong *)((long)auStack_298 + lVar3) ^ *(ulong *)((long)auStack_1d8 + lVar3);
    auVar11._8_8_ = uVar2 ^ *(ulong *)((long)auStack_1d8 + lVar3 + 8);
    auVar9._0_8_ = *(ulong *)((long)auStack_298 + lVar3) ^ *(ulong *)((long)auStack_2f8 + lVar3);
    auVar9._8_8_ = uVar2 ^ *(ulong *)((long)auStack_2f8 + lVar3 + 8);
    *(undefined1 (*) [16])((long)auStack_188 + lVar3) = auVar7;
    auVar15 = vpsrldq_avx(auVar7,8);
    auVar12 = vpshldq_avx512_vbmi2(auVar12,auVar10,0x3e);
    auVar14._0_8_ = auVar9._0_8_ ^ *(ulong *)((long)auStack_178 + lVar3);
    auVar14._8_8_ = auVar9._8_8_ ^ *(ulong *)((long)auStack_178 + lVar3 + 8);
    auVar10 = vpshldq_avx512_vbmi2(auVar15,auVar7,0x3f);
    auVar15 = vpsrldq_avx(auVar11,8);
    auVar7 = vpslldq_avx(auVar11,8);
    *(undefined1 (*) [16])((long)auStack_1d8 + lVar3) = auVar11;
    auVar11 = vpshldq_avx512_vbmi2(auVar15,auVar11,0x3e);
    auVar13 = vpslldq_avx(auVar14,8);
    auVar16 = vpsrldq_avx(auVar14,8);
    *(undefined1 (*) [16])((long)auStack_178 + lVar3) = auVar14;
    auVar15 = vpsllq_avx(auVar7,0x3e);
    auVar7 = vpshldq_avx512_vbmi2(auVar16,auVar14,0x3f);
    auVar14 = vpsllq_avx(auVar13,0x3f);
    auVar10 = vpor_avx(auVar14,auVar10);
    auVar12 = vpternlogq_avx512vl(auVar12,auVar10,auVar15,0x36);
    *(undefined1 (*) [16])((long)auStack_2f8 + lVar3) = auVar7;
    *(undefined1 (*) [16])((long)auStack_308 + lVar3) = auVar10;
    *(undefined1 (*) [16])((long)auStack_2a8 + lVar3) = auVar12;
    auVar10 = vpternlogq_avx512vl(auVar12,*(undefined1 (*) [16])(auStack_128 + lVar3) ^
                                          *(undefined1 (*) [16])(auStack_248 + lVar3),auVar8,0x96);
    auVar12 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_118 + lVar3) ^
                                  *(undefined1 (*) [16])(auStack_238 + lVar3),auVar7 ^ auVar11,
                                  auVar9,0x96);
    *(undefined1 (*) [16])((long)auStack_298 + lVar3) = auVar7 ^ auVar11;
    *(undefined1 (*) [16])(auStack_128 + lVar3) = auVar10;
    *(undefined1 (*) [16])(auStack_118 + lVar3) = auVar12;
    *(undefined1 (*) [16])((long)out->w64 + lVar3) = auVar10;
    *(undefined1 (*) [16])((long)out->w64 + lVar3 + 0x10) = auVar12;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x60);
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mpc_sbox_prove_s128_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                           const rvec_t* rvec, const mzd_local_t* mask_a,
                                           const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  bitsliced_mm128_256_step_1(SC_PROOF, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm128_256_and_def(NROLR, r0m, x0s, x1s, r2m, 0);
  // b & c
  mpc_mm128_256_and_def(mm128_shift_right_256, r2m, x1s, x2m, r1s, 1);
  // c & a
  mpc_mm128_256_and_def(mm128_shift_right_256, r1m, x0s, x2m, r0s, 2);

  bitsliced_mm128_256_step_2(SC_PROOF);
}